

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86MOVSX(uchar *stream,x86Reg dst,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift
            )

{
  uchar uVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *start;
  x86Reg base_local;
  int multiplier_local;
  x86Reg index_local;
  x86Size size_local;
  x86Reg dst_local;
  uchar *stream_local;
  
  if (size == sDWORD || size == sQWORD) {
    __assert_fail("size != sDWORD && size != sQWORD",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x3cc,"int x86MOVSX(unsigned char *, x86Reg, x86Size, x86Reg, int, x86Reg, int)")
    ;
  }
  start._4_4_ = base;
  base_local = index;
  if (((base == rNONE) && (index != rNONE)) && (multiplier == 1)) {
    base_local = rNONE;
    start._4_4_ = index;
  }
  uVar2 = encodeRex(stream,false,dst,base_local,start._4_4_);
  puVar3 = stream + uVar2;
  *puVar3 = '\x0f';
  uVar1 = 0xbf;
  if (size == sBYTE) {
    uVar1 = 0xbe;
  }
  puVar3[1] = uVar1;
  uVar2 = encodeAddress(puVar3 + 2,base_local,multiplier,start._4_4_,shift,(int)regCode[dst]);
  return ((int)(puVar3 + 2) + uVar2) - (int)stream;
}

Assistant:

int x86MOVSX(unsigned char *stream, x86Reg dst, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift)
{
	unsigned char *start = stream;

	assert(size != sDWORD && size != sQWORD);

	if(base == rNONE && index != rNONE && multiplier == 1)	// swap so if there is only one register, it will be base
	{
		base = index;
		index = rNONE;
	}

	stream += encodeRex(stream, false, dst, index, base);

	*stream++ = 0x0f;
	*stream++ = size == sBYTE ? 0xbe : 0xbf;
	stream += encodeAddress(stream, index, multiplier, base, shift, regCode[dst]);

	return int(stream - start);
}